

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

ClassObject * __thiscall LiteScript::ClassObject::operator=(ClassObject *this,ClassObject *obj)

{
  ulong uVar1;
  long lVar2;
  
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
  ::_M_erase_at_end(&this->members,
                    (this->members).
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  uVar1 = ((long)(obj->members).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(obj->members).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555;
  if ((int)uVar1 != 0) {
    lVar2 = 0;
    do {
      std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
      ::push_back(&this->members,
                  (value_type *)
                  ((long)&(((obj->members).
                            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_LiteScript::Variable>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->first)._M_dataplus + lVar2))
      ;
      lVar2 = lVar2 + 0x30;
    } while ((uVar1 & 0xffffffff) * 0x30 != lVar2);
  }
  this->ClassBase = obj->ClassBase;
  this->ScriptState = obj->ScriptState;
  return this;
}

Assistant:

LiteScript::ClassObject& LiteScript::ClassObject::operator=(const ClassObject &obj) {
    this->members.clear();
    for (unsigned int i = 0, sz = obj.members.size(); i < sz; i++)
        this->members.push_back(obj.members[i]);
    this->ClassBase = obj.ClassBase;
    this->ScriptState = obj.ScriptState;
    return *this;
}